

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void prvTidyCheckAttributes(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  AttVal *local_28;
  AttVal *attval;
  AttVal *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  local_28 = node->attributes;
  while (local_28 != (AttVal *)0x0) {
    pAVar1 = local_28->next;
    prvTidyCheckAttribute(doc,node,local_28);
    local_28 = pAVar1;
  }
  return;
}

Assistant:

void TY_(CheckAttributes)( TidyDocImpl* doc, Node *node )
{
    AttVal *next, *attval = node->attributes;
    while (attval)
    {
        next = attval->next;
        TY_(CheckAttribute)( doc, node, attval );
        attval = next;
    }
}